

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O2

int ngp_keyword_is_write(NGP_TOKEN *ngp_tok)

{
  char cVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  
  if (ngp_tok == (NGP_TOKEN *)0x0) {
    return 0x16a;
  }
  pcVar6 = ngp_tok->name;
  lVar5 = 0;
  while (lVar5 != 0x50) {
    iVar3 = strcmp(*(char **)((long)ngp_keyword_is_write::nmni + lVar5),pcVar6);
    lVar5 = lVar5 + 8;
    if (iVar3 == 0) {
      return 0x170;
    }
  }
  lVar5 = 0;
  do {
    if (lVar5 == 0x18) {
      return 0;
    }
    __s = *(char **)((long)ngp_keyword_is_write::nm + lVar5);
    sVar4 = strlen(__s);
    if (0xfffffffa < (int)sVar4 - 6U) {
      iVar3 = strncmp(__s,pcVar6,sVar4 & 0xffffffff);
      if (iVar3 == 0) {
        if ((byte)(pcVar6[sVar4 & 0xffffffff] - 0x3aU) < 0xf7) {
          return 0;
        }
        pcVar6 = ngp_tok->name + (sVar4 & 0xffffffff) + 1;
        bVar2 = true;
        do {
          if (6 < (int)sVar4) {
            return 0x170;
          }
          cVar1 = *pcVar6;
          if (bVar2) {
            bVar2 = true;
            if ((9 < (byte)(cVar1 - 0x30U)) && (bVar2 = false, cVar1 != ' ')) {
              if (cVar1 == '\0') {
                return 0x170;
              }
              return 0;
            }
          }
          else {
            bVar2 = false;
            if (cVar1 != ' ') {
              return 0;
            }
          }
          sVar4 = (size_t)((int)sVar4 + 1);
          pcVar6 = pcVar6 + 1;
        } while( true );
      }
    }
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

int	ngp_keyword_is_write(NGP_TOKEN *ngp_tok)
 { int i, j, l, spc;
                        /* indexed variables not to write */

   static char *nm[] = { "NAXIS", "TFORM", "TTYPE", NULL } ;

                        /* non indexed variables not allowed to write */
  
   static char *nmni[] = { "SIMPLE", "XTENSION", "BITPIX", "NAXIS", "PCOUNT",
                           "GCOUNT", "TFIELDS", "THEAP", "EXTEND", "EXTVER",
                           NULL } ;

   if (NULL == ngp_tok) return(NGP_NUL_PTR);

   for (j = 0; ; j++)           /* first check non indexed */
    { if (NULL == nmni[j]) break;
      if (0 == strcmp(nmni[j], ngp_tok->name)) return(NGP_BAD_ARG);
    } 

   for (j = 0; ; j++)           /* now check indexed */
    { if (NULL == nm[j]) return(NGP_OK);
      l = strlen(nm[j]);
      if ((l < 1) || (l > 5)) continue;
      if (0 == strncmp(nm[j], ngp_tok->name, l)) break;
    } 

   if ((ngp_tok->name[l] < '1') || (ngp_tok->name[l] > '9')) return(NGP_OK);
   spc = 0;
   for (i = l + 1; i < 8; i++)
    { if (spc) { if (' ' != ngp_tok->name[i]) return(NGP_OK); }
      else
       { if ((ngp_tok->name[i] >= '0') && (ngp_tok->name[i] <= '9')) continue;
         if (' ' == ngp_tok->name[i]) { spc = 1; continue; }
         if (0 == ngp_tok->name[i]) break;
         return(NGP_OK);
       }
    }
   return(NGP_BAD_ARG);
 }